

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::TryConsume(ParserImpl *this,string *value)

{
  __type _Var1;
  
  _Var1 = std::operator==(&(this->tokenizer_).current_.text,value);
  if (_Var1) {
    io::Tokenizer::Next(&this->tokenizer_);
  }
  return _Var1;
}

Assistant:

bool TryConsume(const std::string& value) {
    if (tokenizer_.current().text == value) {
      tokenizer_.Next();
      return true;
    } else {
      return false;
    }
  }